

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

size_t __thiscall asmjit::CodeHolder::getCodeSize(CodeHolder *this)

{
  if (this->_cgAsm != (Assembler *)0x0) {
    (*(this->_cgAsm->super_CodeEmitter)._vptr_CodeEmitter[0x10])();
  }
  if ((this->_sections).super_ZoneVectorBase._length != 0) {
    return (ulong)this->_trampolinesSize +
           *(long *)(*(this->_sections).super_ZoneVectorBase._data + 0x40);
  }
  getCodeSize();
}

Assistant:

size_t CodeHolder::getCodeSize() const noexcept {
  // Reflect all changes first.
  const_cast<CodeHolder*>(this)->sync();

  // TODO: Support sections.
  return _sections[0]->_buffer._length + getTrampolinesSize();
}